

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  mz_zip_internal_state *pmVar9;
  undefined4 *puVar10;
  void *pvVar11;
  ulong uVar12;
  ushort uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  mz_uint32 t_1;
  long lVar22;
  byte *pbVar23;
  ulong uVar24;
  mz_uint32 t;
  byte bVar25;
  ulong uVar26;
  byte *pbVar27;
  ulong uVar28;
  bool bVar29;
  
  uVar5 = pZip->m_total_files;
  uVar12 = (ulong)uVar5;
  if (1 < uVar12) {
    pmVar9 = pZip->m_pState;
    if ((pmVar9->m_sorted_central_dir_offsets).m_size == 0) {
LAB_0013c16a:
      __assert_fail("index < pArray->m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                    ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
    }
    puVar10 = (undefined4 *)(pmVar9->m_sorted_central_dir_offsets).m_p;
    uVar15 = uVar5 - 2 >> 1;
    do {
      uVar16 = (ulong)uVar15;
      uVar20 = uVar16;
      while (uVar18 = uVar20 * 2 + 1, uVar18 < uVar12) {
        if (uVar20 * 2 + 2 < uVar12) {
          uVar24 = (pmVar9->m_central_dir_offsets).m_size;
          if (uVar24 <= (uint)puVar10[uVar18]) goto LAB_0013c16a;
          pvVar11 = (pmVar9->m_central_dir_offsets).m_p;
          uVar17 = (ulong)*(uint *)((long)pvVar11 + (ulong)(uint)puVar10[uVar18] * 4);
          uVar26 = (pmVar9->m_central_dir).m_size;
          if (((uVar26 <= uVar17) || (uVar24 <= (uint)puVar10[uVar20 * 2 + 2])) ||
             (uVar24 = (ulong)*(uint *)((long)pvVar11 + (ulong)(uint)puVar10[uVar20 * 2 + 2] * 4),
             uVar26 <= uVar24)) goto LAB_0013c16a;
          pvVar11 = (pmVar9->m_central_dir).m_p;
          uVar3 = *(ushort *)((long)pvVar11 + uVar17 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar11 + uVar24 + 0x1c);
          pbVar23 = (byte *)((long)pvVar11 + uVar17 + 0x2e);
          uVar13 = uVar4;
          if (uVar3 < uVar4) {
            uVar13 = uVar3;
          }
          pbVar1 = (byte *)((long)pvVar11 + (ulong)uVar13 + uVar17 + 0x2e);
          if (uVar13 == 0) {
            bVar14 = 0;
            bVar25 = 0;
          }
          else {
            pbVar27 = (byte *)((long)pvVar11 + uVar24 + 0x2e);
            do {
              bVar25 = *pbVar23;
              bVar14 = bVar25 + 0x20;
              if (0x19 < (byte)(bVar25 + 0xbf)) {
                bVar14 = bVar25;
              }
              bVar2 = *pbVar27;
              bVar25 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar25 = bVar2;
              }
              if (bVar14 != bVar25) break;
              pbVar23 = pbVar23 + 1;
              pbVar27 = pbVar27 + 1;
            } while (pbVar23 < pbVar1);
          }
          bVar29 = bVar14 < bVar25;
          if (pbVar23 == pbVar1) {
            bVar29 = uVar3 < uVar4;
          }
          uVar24 = (ulong)bVar29;
        }
        else {
          uVar24 = 0;
        }
        uVar6 = puVar10[uVar20];
        uVar26 = (pmVar9->m_central_dir_offsets).m_size;
        if (uVar26 <= uVar6) goto LAB_0013c16a;
        pvVar11 = (pmVar9->m_central_dir_offsets).m_p;
        uVar28 = (ulong)*(uint *)((long)pvVar11 + (ulong)uVar6 * 4);
        uVar17 = (pmVar9->m_central_dir).m_size;
        if (uVar17 <= uVar28) goto LAB_0013c16a;
        uVar24 = uVar24 + uVar18;
        uVar7 = puVar10[uVar24];
        if ((uVar26 <= uVar7) ||
           (uVar18 = (ulong)*(uint *)((long)pvVar11 + (ulong)uVar7 * 4), uVar17 <= uVar18))
        goto LAB_0013c16a;
        pvVar11 = (pmVar9->m_central_dir).m_p;
        uVar3 = *(ushort *)((long)pvVar11 + uVar28 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar11 + uVar18 + 0x1c);
        pbVar23 = (byte *)((long)pvVar11 + uVar28 + 0x2e);
        uVar13 = uVar4;
        if (uVar3 < uVar4) {
          uVar13 = uVar3;
        }
        pbVar1 = (byte *)((long)pvVar11 + (ulong)uVar13 + uVar28 + 0x2e);
        if (uVar13 == 0) {
          bVar25 = 0;
          bVar14 = 0;
        }
        else {
          pbVar27 = (byte *)((long)pvVar11 + uVar18 + 0x2e);
          do {
            bVar14 = *pbVar23;
            bVar25 = bVar14 + 0x20;
            if (0x19 < (byte)(bVar14 + 0xbf)) {
              bVar25 = bVar14;
            }
            bVar2 = *pbVar27;
            bVar14 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar14 = bVar2;
            }
            if (bVar25 != bVar14) break;
            pbVar23 = pbVar23 + 1;
            pbVar27 = pbVar27 + 1;
          } while (pbVar23 < pbVar1);
        }
        bVar29 = bVar14 <= bVar25;
        if (pbVar23 == pbVar1) {
          bVar29 = uVar4 <= uVar3;
        }
        if (bVar29) break;
        puVar10[uVar20] = uVar7;
        puVar10[uVar24] = uVar6;
        uVar20 = uVar24;
      }
      bVar29 = uVar15 == 0;
      uVar15 = uVar15 - 1;
      if (bVar29) {
        uVar15 = 0;
      }
    } while (uVar16 != 0);
    if (uVar5 - 1 != 0) {
      uVar12 = (ulong)(uVar5 - 1);
      do {
        uVar8 = puVar10[uVar12];
        puVar10[uVar12] = *puVar10;
        *puVar10 = uVar8;
        if (1 < uVar12) {
          uVar20 = 1;
          lVar22 = 0;
          lVar19 = 0;
          do {
            if (lVar22 + 2U < uVar12) {
              uVar16 = (pmVar9->m_central_dir_offsets).m_size;
              if (uVar16 <= (uint)puVar10[uVar20]) goto LAB_0013c16a;
              pvVar11 = (pmVar9->m_central_dir_offsets).m_p;
              uVar24 = (ulong)*(uint *)((long)pvVar11 + (ulong)(uint)puVar10[uVar20] * 4);
              uVar18 = (pmVar9->m_central_dir).m_size;
              if (((uVar18 <= uVar24) || (uVar16 <= (uint)puVar10[lVar22 + 2])) ||
                 (uVar16 = (ulong)*(uint *)((long)pvVar11 + (ulong)(uint)puVar10[lVar22 + 2] * 4),
                 uVar18 <= uVar16)) goto LAB_0013c16a;
              pvVar11 = (pmVar9->m_central_dir).m_p;
              uVar3 = *(ushort *)((long)pvVar11 + uVar24 + 0x1c);
              uVar4 = *(ushort *)((long)pvVar11 + uVar16 + 0x1c);
              pbVar23 = (byte *)((long)pvVar11 + uVar24 + 0x2e);
              uVar13 = uVar4;
              if (uVar3 < uVar4) {
                uVar13 = uVar3;
              }
              pbVar1 = (byte *)((long)pvVar11 + (ulong)uVar13 + uVar24 + 0x2e);
              if (uVar13 == 0) {
                bVar14 = 0;
                bVar25 = 0;
              }
              else {
                pbVar27 = (byte *)((long)pvVar11 + uVar16 + 0x2e);
                do {
                  bVar25 = *pbVar23;
                  bVar14 = bVar25 + 0x20;
                  if (0x19 < (byte)(bVar25 + 0xbf)) {
                    bVar14 = bVar25;
                  }
                  bVar2 = *pbVar27;
                  bVar25 = bVar2 + 0x20;
                  if (0x19 < (byte)(bVar2 + 0xbf)) {
                    bVar25 = bVar2;
                  }
                  if (bVar14 != bVar25) break;
                  pbVar23 = pbVar23 + 1;
                  pbVar27 = pbVar27 + 1;
                } while (pbVar23 < pbVar1);
              }
              bVar29 = bVar14 < bVar25;
              if (pbVar23 == pbVar1) {
                bVar29 = uVar3 < uVar4;
              }
              uVar16 = (ulong)bVar29;
            }
            else {
              uVar16 = 0;
            }
            uVar5 = puVar10[lVar19];
            uVar18 = (pmVar9->m_central_dir_offsets).m_size;
            if (uVar18 <= uVar5) goto LAB_0013c16a;
            pvVar11 = (pmVar9->m_central_dir_offsets).m_p;
            uVar26 = (ulong)*(uint *)((long)pvVar11 + (ulong)uVar5 * 4);
            uVar24 = (pmVar9->m_central_dir).m_size;
            if (uVar24 <= uVar26) goto LAB_0013c16a;
            lVar21 = uVar16 + uVar20;
            uVar15 = puVar10[lVar21];
            if ((uVar18 <= uVar15) ||
               (uVar20 = (ulong)*(uint *)((long)pvVar11 + (ulong)uVar15 * 4), uVar24 <= uVar20))
            goto LAB_0013c16a;
            pvVar11 = (pmVar9->m_central_dir).m_p;
            uVar3 = *(ushort *)((long)pvVar11 + uVar26 + 0x1c);
            uVar4 = *(ushort *)((long)pvVar11 + uVar20 + 0x1c);
            pbVar23 = (byte *)((long)pvVar11 + uVar26 + 0x2e);
            uVar13 = uVar4;
            if (uVar3 < uVar4) {
              uVar13 = uVar3;
            }
            pbVar1 = (byte *)((long)pvVar11 + (ulong)uVar13 + uVar26 + 0x2e);
            if (uVar13 == 0) {
              bVar14 = 0;
              bVar25 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar11 + uVar20 + 0x2e);
              do {
                bVar25 = *pbVar23;
                bVar14 = bVar25 + 0x20;
                if (0x19 < (byte)(bVar25 + 0xbf)) {
                  bVar14 = bVar25;
                }
                bVar2 = *pbVar27;
                bVar25 = bVar2 + 0x20;
                if (0x19 < (byte)(bVar2 + 0xbf)) {
                  bVar25 = bVar2;
                }
                if (bVar14 != bVar25) break;
                pbVar23 = pbVar23 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar23 < pbVar1);
            }
            bVar29 = bVar25 <= bVar14;
            if (pbVar23 == pbVar1) {
              bVar29 = uVar4 <= uVar3;
            }
            if (bVar29) break;
            puVar10[lVar19] = uVar15;
            puVar10[lVar21] = uVar5;
            lVar22 = lVar21 * 2;
            uVar20 = lVar21 * 2 + 1;
            lVar19 = lVar21;
          } while (uVar20 < uVar12);
        }
        uVar12 = uVar12 - 1;
      } while ((int)uVar12 != 0);
    }
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive* pZip) {

    mz_zip_internal_state* pState = pZip->m_pState;
    const mz_zip_array* pCentral_dir_offsets = &pState->m_central_dir_offsets;
    const mz_zip_array* pCentral_dir = &pState->m_central_dir;
    mz_uint32* pIndices;
    mz_uint32 start, end;
    const mz_uint32 size = pZip->m_total_files;

    if (size <= 1U)
        return;

    pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);

    start = (size - 2U) >> 1U;
    for (;;) {
        mz_uint64 child, root = start;
        for (;;) {
            if ((child = (root << 1U) + 1U) >= size)
                break;
            child += (((child + 1U) < size) && (mz_zip_reader_filename_less(pCentral_dir,
                                                                            pCentral_dir_offsets,
                                                                            pIndices[child],
                                                                            pIndices[child + 1U])));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        if (!start)
            break;
        start--;
    }

    end = size - 1;
    while (end > 0) {
        mz_uint64 child, root = 0;
        MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
        for (;;) {
            if ((child = (root << 1U) + 1U) >= end)
                break;
            child += (((child + 1U) < end) && mz_zip_reader_filename_less(pCentral_dir,
                                                                          pCentral_dir_offsets,
                                                                          pIndices[child],
                                                                          pIndices[child + 1U]));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        end--;
    }
}